

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O3

void bonk_forget(t_bonk *x)

{
  t_template_conflict *ptVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = x->x_ntemplate - x->x_ninsig;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
  }
  ptVar1 = (t_template_conflict *)resizebytes(x->x_template,(long)x->x_ntemplate * 800,uVar3 * 800);
  x->x_template = ptVar1;
  x->x_ntemplate = (int)uVar3;
  x->x_learncount = 0;
  return;
}

Assistant:

static void bonk_forget(t_bonk *x)
{
    int ntemplate = x->x_ntemplate, newn = ntemplate - x->x_ninsig;
    if (newn < 0) newn = 0;
    x->x_template = (t_template *)t_resizebytes(x->x_template,
        x->x_ntemplate * sizeof(x->x_template[0]),
            newn * sizeof(x->x_template[0]));
    x->x_ntemplate = newn;
    x->x_learncount = 0;
}